

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerqueue_unittest.cpp
# Opt level: O2

int main(void)

{
  EventLoop *this;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  TimerId TVar1;
  undefined1 local_1318 [8];
  TimerId TStack_1310;
  _Invoker_type p_Stack_1300;
  undefined1 local_348 [8];
  EventLoop loop;
  undefined1 local_1e0 [12];
  undefined1 local_1d0 [12];
  undefined1 local_1c0 [12];
  code *local_1b0 [2];
  code *local_1a0;
  code *local_198;
  TimerCallback local_190;
  TimerCallback local_170;
  TimerCallback local_150;
  TimerCallback local_130;
  TimerCallback local_110;
  TimerCallback local_f0;
  TimerCallback local_d0;
  TimerCallback local_b0;
  TimerCallback local_90;
  TimerCallback local_70;
  string local_50;
  
  TStack_1310.m_sequence = (int64_t)TStack_1310.m_timer;
  printid();
  local_1318 = (undefined1  [8])0x1;
  std::this_thread::sleep_for<long,std::ratio<1l,1l>>
            ((duration<long,_std::ratio<1L,_1L>_> *)local_1318);
  sznet::net::EventLoop::EventLoop((EventLoop *)local_348);
  g_timequeue_loop = (EventLoop *)local_348;
  if (sznet::g_logLevel < 3) {
    sznet::Logger::SourceFile::SourceFile<111>
              ((SourceFile *)local_1e0,
               (char (*) [111])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/timer/timerqueue_unittest.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_1e0._0_8_;
    file.m_size = local_1e0._8_4_;
    sznet::Logger::Logger((Logger *)local_1318,file,0x32);
    sznet::LogStream::operator<<((LogStream *)&TStack_1310,"main");
    sznet::Logger::~Logger((Logger *)local_1318);
  }
  local_1318 = (undefined1  [8])print;
  TStack_1310.m_timer = (Timer *)0x119112;
  std::function<void()>::function<std::_Bind<void(*(char_const*))(char_const*)>,void>
            ((function<void()> *)&local_190,
             (_Bind<void_(*(const_char_*))(const_char_*)> *)local_1318);
  sznet::net::EventLoop::runAfter((EventLoop *)local_348,1.0,&local_190);
  std::_Function_base::~_Function_base(&local_190.super__Function_base);
  local_1318 = (undefined1  [8])print;
  TStack_1310.m_timer = (Timer *)0x119118;
  std::function<void()>::function<std::_Bind<void(*(char_const*))(char_const*)>,void>
            ((function<void()> *)&local_170,
             (_Bind<void_(*(const_char_*))(const_char_*)> *)local_1318);
  sznet::net::EventLoop::runAfter((EventLoop *)local_348,1.5,&local_170);
  std::_Function_base::~_Function_base(&local_170.super__Function_base);
  local_1318 = (undefined1  [8])print;
  TStack_1310.m_timer = (Timer *)0x119120;
  std::function<void()>::function<std::_Bind<void(*(char_const*))(char_const*)>,void>
            ((function<void()> *)&local_150,
             (_Bind<void_(*(const_char_*))(const_char_*)> *)local_1318);
  sznet::net::EventLoop::runEvery((EventLoop *)local_348,2.0,&local_150);
  std::_Function_base::~_Function_base(&local_150.super__Function_base);
  local_1318 = (undefined1  [8])print;
  TStack_1310.m_timer = (Timer *)0x119127;
  std::function<void()>::function<std::_Bind<void(*(char_const*))(char_const*)>,void>
            ((function<void()> *)&local_130,
             (_Bind<void_(*(const_char_*))(const_char_*)> *)local_1318);
  sznet::net::EventLoop::runAfter((EventLoop *)local_348,2.5,&local_130);
  std::_Function_base::~_Function_base(&local_130.super__Function_base);
  local_1318 = (undefined1  [8])print;
  TStack_1310.m_timer = (Timer *)0x11912f;
  std::function<void()>::function<std::_Bind<void(*(char_const*))(char_const*)>,void>
            ((function<void()> *)&local_110,
             (_Bind<void_(*(const_char_*))(const_char_*)> *)local_1318);
  sznet::net::EventLoop::runAfter((EventLoop *)local_348,3.5,&local_110);
  std::_Function_base::~_Function_base(&local_110.super__Function_base);
  local_1318 = (undefined1  [8])print;
  TStack_1310.m_timer = (Timer *)"once4.5";
  std::function<void()>::function<std::_Bind<void(*(char_const*))(char_const*)>,void>
            ((function<void()> *)&local_f0,(_Bind<void_(*(const_char_*))(const_char_*)> *)local_1318
            );
  TVar1 = sznet::net::EventLoop::runAfter((EventLoop *)local_348,4.5,&local_f0);
  std::_Function_base::~_Function_base(&local_f0.super__Function_base);
  local_1318 = (undefined1  [8])cancel;
  TStack_1310 = TVar1;
  std::function<void()>::function<std::_Bind<void(*(sznet::TimerId))(sznet::TimerId)>,void>
            ((function<void()> *)&local_d0,
             (_Bind<void_(*(sznet::TimerId))(sznet::TimerId)> *)local_1318);
  sznet::net::EventLoop::runAfter((EventLoop *)local_348,4.2,&local_d0);
  std::_Function_base::~_Function_base(&local_d0.super__Function_base);
  local_1318 = (undefined1  [8])cancel;
  TStack_1310 = TVar1;
  std::function<void()>::function<std::_Bind<void(*(sznet::TimerId))(sznet::TimerId)>,void>
            ((function<void()> *)&local_b0,
             (_Bind<void_(*(sznet::TimerId))(sznet::TimerId)> *)local_1318);
  sznet::net::EventLoop::runAfter((EventLoop *)local_348,4.8,&local_b0);
  std::_Function_base::~_Function_base(&local_b0.super__Function_base);
  local_1318 = (undefined1  [8])print;
  TStack_1310.m_timer = (Timer *)"every3";
  std::function<void()>::function<std::_Bind<void(*(char_const*))(char_const*)>,void>
            ((function<void()> *)&local_90,(_Bind<void_(*(const_char_*))(const_char_*)> *)local_1318
            );
  TVar1 = sznet::net::EventLoop::runEvery((EventLoop *)local_348,3.0,&local_90);
  std::_Function_base::~_Function_base(&local_90.super__Function_base);
  local_1318 = (undefined1  [8])cancel;
  TStack_1310 = TVar1;
  std::function<void()>::function<std::_Bind<void(*(sznet::TimerId))(sznet::TimerId)>,void>
            ((function<void()> *)&local_70,
             (_Bind<void_(*(sznet::TimerId))(sznet::TimerId)> *)local_1318);
  sznet::net::EventLoop::runAfter((EventLoop *)local_348,9.001,&local_70);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  sznet::net::EventLoop::loop((EventLoop *)local_348);
  if (sznet::g_logLevel < 3) {
    sznet::Logger::SourceFile::SourceFile<111>
              ((SourceFile *)local_1d0,
               (char (*) [111])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/timer/timerqueue_unittest.cpp"
              );
    file_00._12_4_ = 0;
    file_00.m_data = (char *)local_1d0._0_8_;
    file_00.m_size = local_1d0._8_4_;
    sznet::Logger::Logger((Logger *)local_1318,file_00,0x40);
    sznet::LogStream::operator<<((LogStream *)&TStack_1310,"main loop exits");
    sznet::Logger::~Logger((Logger *)local_1318);
  }
  sznet::net::EventLoop::~EventLoop((EventLoop *)local_348);
  local_1318 = (undefined1  [8])0x1;
  std::this_thread::sleep_for<long,std::ratio<1l,1l>>
            ((duration<long,_std::ratio<1L,_1L>_> *)local_1318);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_1318 = (undefined1  [8])0x0;
  TStack_1310 = (TimerId)ZEXT816(0);
  p_Stack_1300 = (_Invoker_type)0x0;
  local_50.field_2._M_local_buf[0] = '\0';
  sznet::net::EventLoopThread::EventLoopThread
            ((EventLoopThread *)local_348,(ThreadInitCallback *)local_1318,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::_Function_base::~_Function_base((_Function_base *)local_1318);
  this = sznet::net::EventLoopThread::startLoop((EventLoopThread *)local_348);
  local_1b0[1] = (code *)0x0;
  local_1b0[0] = printid;
  local_198 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_1a0 = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  sznet::net::EventLoop::runAfter(this,2.0,(TimerCallback *)local_1b0);
  std::_Function_base::~_Function_base((_Function_base *)local_1b0);
  local_1318 = (undefined1  [8])0x3;
  std::this_thread::sleep_for<long,std::ratio<1l,1l>>
            ((duration<long,_std::ratio<1L,_1L>_> *)local_1318);
  if (sznet::g_logLevel < 3) {
    sznet::Logger::SourceFile::SourceFile<111>
              ((SourceFile *)local_1c0,
               (char (*) [111])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/timer/timerqueue_unittest.cpp"
              );
    file_01._12_4_ = 0;
    file_01.m_data = (char *)local_1c0._0_8_;
    file_01.m_size = local_1c0._8_4_;
    sznet::Logger::Logger((Logger *)local_1318,file_01,0x48);
    sznet::LogStream::operator<<((LogStream *)&TStack_1310,"thread loop exits");
    sznet::Logger::~Logger((Logger *)local_1318);
  }
  sznet::net::EventLoopThread::~EventLoopThread((EventLoopThread *)local_348);
  std::istream::get();
  return 0;
}

Assistant:

int main()
{
	printid();
	std::this_thread::sleep_for(std::chrono::seconds(1));
	{
		EventLoop loop;
		g_timequeue_loop = &loop;

		LOG_INFO << "main";
		loop.runAfter(1, std::bind(print, "once1"));
		loop.runAfter(1.5, std::bind(print, "once1.5"));
		loop.runEvery(2, std::bind(print, "every2"));
		loop.runAfter(2.5, std::bind(print, "once2.5"));
		loop.runAfter(3.5, std::bind(print, "once3.5"));

		TimerId t45 = loop.runAfter(4.5, std::bind(print, "once4.5"));
		loop.runAfter(4.2, std::bind(cancel, t45));
		loop.runAfter(4.8, std::bind(cancel, t45));
		TimerId t3 = loop.runEvery(3, std::bind(print, "every3"));
		loop.runAfter(9.001, std::bind(cancel, t3));

		loop.loop();
		LOG_INFO << "main loop exits";
	}
	std::this_thread::sleep_for(std::chrono::seconds(1));
	{
		EventLoopThread loopThread;
		EventLoop* loop = loopThread.startLoop();
		loop->runAfter(2, printid);
		std::this_thread::sleep_for(std::chrono::seconds(3));
		LOG_INFO << "thread loop exits";
	}
	std::cin.get();
	return 0;
}